

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMixedMeshControl::GroupandCondenseElements(TPZMHMixedMeshControl *this)

{
  TPZCompEl *pTVar1;
  TPZSubCompMesh *this_00;
  _Base_ptr p_Var2;
  _Self __tmp;
  TPZAutoPointer<TPZGuiInterface> local_40;
  TPZAutoPointer<TPZGuiInterface> guiInterface;
  
  p_Var2 = (this->super_TPZMHMeshControl).fMHMtoSubCMesh._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 ==
        &(this->super_TPZMHMeshControl).fMHMtoSubCMesh._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    pTVar1 = TPZCompMesh::Element
                       (((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer,
                        (int64_t)p_Var2[1]._M_parent);
    if (pTVar1 == (TPZCompEl *)0x0) break;
    this_00 = (TPZSubCompMesh *)
              __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
    if (this_00 == (TPZSubCompMesh *)0x0) break;
    TPZCompMeshTools::GroupElements((TPZCompMesh *)this_00);
    (**(code **)(*(long *)&this_00->super_TPZCompMesh + 0x78))(this_00);
    TPZCompMeshTools::CreatedCondensedElements((TPZCompMesh *)this_00,true,true);
    (**(code **)(*(long *)&this_00->super_TPZCompMesh + 0x88))(this_00);
    TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer(&guiInterface);
    local_40.fRef = guiInterface.fRef;
    LOCK();
    ((guiInterface.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((guiInterface.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZSubCompMesh::SetAnalysisSkyline(this_00,0,0,&local_40);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_40);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&guiInterface);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
             ,0x514);
}

Assistant:

void TPZMHMixedMeshControl::GroupandCondenseElements()
{
    for (std::map<int64_t,int64_t>::iterator it=fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
        TPZCompEl *cel = fCMesh->Element(it->second);
        TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *>(cel);
        if (!subcmesh) {
            DebugStop();
        }
        TPZCompMeshTools::GroupElements(subcmesh);
        subcmesh->ComputeNodElCon();
        
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            subcmesh->Print(sout);
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // TODO: increment nelconnected of exterior connects
        bool keeplagrange = true;
        TPZCompMeshTools::CreatedCondensedElements(subcmesh, keeplagrange);
        subcmesh->CleanUpUnconnectedNodes();
        int numthreads = 0;
        int preconditioned = 0;
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            subcmesh->Print(sout);
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        TPZAutoPointer<TPZGuiInterface> guiInterface;
        subcmesh->SetAnalysisSkyline(numthreads, preconditioned, guiInterface);
    }
    
}